

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall btLCP::pN_equals_ANC_times_qC(btLCP *this,btScalar *p,btScalar *q)

{
  int n;
  long lVar1;
  ulong uVar2;
  bool bVar3;
  btScalar bVar4;
  
  n = this->m_nC;
  lVar1 = (long)n;
  uVar2 = 0;
  if (0 < this->m_nN) {
    uVar2 = (ulong)(uint)this->m_nN;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    bVar4 = btLargeDot(this->m_A[lVar1],q,n);
    p[lVar1] = bVar4;
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

void btLCP::pN_equals_ANC_times_qC (btScalar *p, btScalar *q)
{
  // we could try to make this matrix-vector multiplication faster using
  // outer product matrix tricks, e.g. with the dMultidotX() functions.
  // but i tried it and it actually made things slower on random 100x100
  // problems because of the overhead involved. so we'll stick with the
  // simple method for now.
  const int nC = m_nC;
  btScalar *ptgt = p + nC;
  const int nN = m_nN;
  for (int i=0; i<nN; ++i) {
    ptgt[i] = btLargeDot (BTAROW(i+nC),q,nC);
  }
}